

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

void dasm_init(BuildCtx *ctx,int maxsection)

{
  ulong uVar1;
  dasm_State *pdVar2;
  ulong __size;
  
  ctx->D = (dasm_State *)0x0;
  uVar1 = 0x10;
  do {
    __size = uVar1;
    uVar1 = __size * 2;
  } while (__size < (long)(maxsection + -1) * 0x28 + 0x78U);
  pdVar2 = (dasm_State *)malloc(__size);
  ctx->D = pdVar2;
  if (pdVar2 != (dasm_State *)0x0) {
    pdVar2->psize = __size;
    pdVar2->lglabels = (int *)0x0;
    pdVar2->lgsize = 0;
    pdVar2->pclabels = (int *)0x0;
    pdVar2->pcsize = 0;
    pdVar2->globals = (void **)0x0;
    pdVar2->maxsection = maxsection;
    memset(pdVar2->sections,0,(long)maxsection * 0x28);
    return;
  }
  exit(1);
}

Assistant:

void dasm_init(Dst_DECL, int maxsection)
{
  dasm_State *D;
  size_t psz = 0;
  Dst_REF = NULL;
  DASM_M_GROW(Dst, struct dasm_State, Dst_REF, psz, DASM_PSZ(maxsection));
  D = Dst_REF;
  D->psize = psz;
  D->lglabels = NULL;
  D->lgsize = 0;
  D->pclabels = NULL;
  D->pcsize = 0;
  D->globals = NULL;
  D->maxsection = maxsection;
  memset((void *)D->sections, 0, maxsection * sizeof(dasm_Section));
}